

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

ValueBufferLayout *
vkt::anon_unknown_0::computeStd140Layout
          (ValueBufferLayout *__return_storage_ptr__,
          vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values)

{
  pointer pEVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  Type dataType;
  int iVar5;
  Entry EVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ::resize(&__return_storage_ptr__->entries,
           ((long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                 _M_impl.super__Vector_impl_data._M_start) / 0x50);
  pEVar1 = (__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = __return_storage_ptr__->size;
  lVar7 = 1;
  uVar10 = 0;
  while( true ) {
    pVVar2 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x50) <= uVar10)
    break;
    dataType = (&(pVVar2->type).m_type)[lVar7 * 2];
    bVar11 = 8 < dataType - 5;
    bVar12 = 8 < dataType - 0x12;
    if (bVar12 && bVar11) {
      iVar3 = 1;
    }
    else {
      iVar3 = glu::getDataTypeMatrixNumColumns(dataType);
      iVar4 = glu::getDataTypeMatrixNumRows(dataType);
      dataType = glu::getDataTypeFloatVec(iVar4);
    }
    iVar5 = glu::getDataTypeScalarSize(dataType);
    iVar4 = 0x10;
    if (iVar5 != 3) {
      iVar4 = iVar5 * 4;
    }
    if (!bVar12 || !bVar11) {
      iVar4 = 0x10;
    }
    uVar9 = -iVar4 & (iVar4 + iVar8) - 1U;
    EVar6.vecStride = iVar4;
    EVar6.offset = uVar9;
    pEVar1[uVar10] = EVar6;
    iVar8 = (iVar3 + -1) * iVar4 + iVar5 * 4 + uVar9;
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 10;
  }
  __return_storage_ptr__->size = iVar8;
  return __return_storage_ptr__;
}

Assistant:

ValueBufferLayout computeStd140Layout (const vector<Value>& values)
{
	ValueBufferLayout layout;

	layout.entries.resize(values.size());

	for (size_t ndx = 0; ndx < values.size(); ++ndx)
	{
		const DataType	basicType	= values[ndx].type.getBasicType();
		const bool		isMatrix	= isDataTypeMatrix(basicType);
		const int		numVecs		= isMatrix ? getDataTypeMatrixNumColumns(basicType) : 1;
		const DataType	vecType		= isMatrix ? glu::getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType)) : basicType;
		const int		vecSize		= getDataTypeScalarSize(vecType);
		const int		alignment	= ((isMatrix || vecSize == 3) ? 4 : vecSize)*int(sizeof(deUint32));

		layout.size			= deAlign32(layout.size, alignment);
		layout.entries[ndx] = ValueBufferLayout::Entry(layout.size, alignment);
		layout.size			+= alignment*(numVecs-1) + vecSize*int(sizeof(deUint32));
	}

	return layout;
}